

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Order.cpp
# Opt level: O0

void __thiscall Order::show(Order *this)

{
  ostream *poVar1;
  void *pvVar2;
  Order *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Order seqId = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->m_seqId);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Order ActionType = ");
  poVar1 = std::operator<<(poVar1,this->m_actionType);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"OrderId = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->m_orderId);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"OrderSide = ");
  poVar1 = std::operator<<(poVar1,this->m_orderSide);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"OrderQty = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->m_orderQty);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"OrderPrice = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->m_orderPrice);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Order::show() const
{
	std::cout << "Order seqId = " << m_seqId << std::endl;
	std::cout << "Order ActionType = " << m_actionType << std::endl;
	std::cout << "OrderId = " << m_orderId << std::endl;
	std::cout << "OrderSide = " << m_orderSide << std::endl;
	std::cout << "OrderQty = " << m_orderQty << std::endl;
	std::cout << "OrderPrice = " << m_orderPrice << std::endl;
}